

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::MakeCheckOpValueString<unsigned_char>(ostream *os,uchar *v)

{
  ostream *poVar1;
  
  if ((byte)(*v - 0x20) < 0x5f) {
    poVar1 = std::operator<<(os,"\'");
    poVar1 = std::operator<<(poVar1,*v);
    std::operator<<(poVar1,"\'");
    return;
  }
  poVar1 = std::operator<<(os,"unsigned char value ");
  std::ostream::operator<<(poVar1,(ushort)*v);
  return;
}

Assistant:

void MakeCheckOpValueString(std::ostream* os, const unsigned char& v) {
  if (v >= 32 && v <= 126) {
    (*os) << "'" << v << "'";
  } else {
    (*os) << "unsigned char value " << static_cast<unsigned short>(v);
  }
}